

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O0

void __thiscall
TPZSkylMatrix<double>::DecomposeColumn
          (TPZSkylMatrix<double> *this,int64_t col,int64_t prevcol,
          list<long,_std::allocator<long>_> *singular)

{
  double dVar1;
  int64_t iVar2;
  int64_t iVar3;
  double *pdVar4;
  double *pdVar5;
  long in_RDX;
  long in_RSI;
  TPZSkylMatrix<double> *in_RDI;
  double pivot;
  double sum;
  double *run2;
  double *run1;
  int64_t minline;
  int64_t skcol;
  int64_t skprev;
  double *ptrcol;
  double *ptrprev;
  int64_t in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff98;
  value_type_conflict5 *__x;
  TPZSkylMatrix<double> *in_stack_ffffffffffffffa0;
  list<long,_std::allocator<long>_> *this_00;
  double *local_58;
  double *local_50;
  long local_48;
  
  iVar2 = SkyHeight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  iVar3 = SkyHeight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  pdVar4 = Diag(in_RDI,in_stack_ffffffffffffff88);
  pdVar5 = Diag(in_RDI,in_stack_ffffffffffffff88);
  if (in_RSI - iVar3 < in_RDX - iVar2) {
    local_48 = in_RDX - iVar2;
  }
  else {
    local_48 = in_RSI - iVar3;
  }
  if (in_RDX < local_48) {
    std::operator<<((ostream *)&std::cout,"error condition\n");
    std::ostream::flush();
  }
  else {
    this_00 = (list<long,_std::allocator<long>_> *)0x0;
    local_58 = pdVar5 + (in_RSI - local_48);
    for (local_50 = pdVar4 + (in_RDX - local_48); local_50 != pdVar4; local_50 = local_50 + -1) {
      this_00 = (list<long,_std::allocator<long>_> *)(*local_50 * *local_58 + (double)this_00);
      local_58 = local_58 + -1;
    }
    *local_58 = *local_58 - (double)this_00;
    if (local_50 == local_58) {
      __x = (value_type_conflict5 *)*local_58;
      if (ABS((double)__x) < 1e-10) {
        std::__cxx11::list<long,_std::allocator<long>_>::push_back(this_00,__x);
        __x = (value_type_conflict5 *)0x3ff0000000000000;
      }
      dVar1 = sqrt((double)__x);
      *local_58 = dVar1;
    }
    else {
      *local_58 = *local_58 / *local_50;
    }
  }
  return;
}

Assistant:

void TPZSkylMatrix<TVar>::DecomposeColumn(int64_t col, int64_t prevcol,std::list<int64_t> &singular){
    TVar *ptrprev;     //Pointer to prev column
    TVar *ptrcol;      //Pointer to col column
    int64_t skprev, skcol; //prev and col Skyline height respectively
    int64_t minline;
    
    skprev = SkyHeight(prevcol);
    skcol = SkyHeight(col);
    
    ptrprev = Diag(prevcol);
    ptrcol = Diag(col);
    
    if((prevcol-skprev) > (col-skcol)){
        minline = prevcol - skprev;
    }else
    {
        minline = col - skcol;
    }
    if(minline > prevcol) {
        cout << "error condition\n";
        cout.flush();
        return;
    }
    TVar *run1 = ptrprev + (prevcol-minline);
    TVar *run2 = ptrcol + (col-minline);
    TVar sum = 0;
    
    while(run1 != ptrprev) sum += (*run1--)*(*run2--);
    *run2-=sum;
    if(run1 != run2){
        *run2 /= *run1;
    }else{
        TVar pivot = *run2;
        if ( fabs(pivot) < fabs((TVar)1.e-10) ) {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "equation " << col << " is singular pivot " << pivot;
            LOGPZ_WARN(logger,sout.str())
#endif
            singular.push_back(col);
            pivot = 1.;
        }
        
        *run2=sqrt(pivot);
    }
    
}